

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# architecture.cc
# Opt level: O3

void __thiscall Architecture::Architecture(Architecture *this)

{
  list<ScopeMapper,_std::allocator<ScopeMapper>_> *plVar1;
  pointer *pppPVar2;
  iterator __position;
  int iVar3;
  Database *pDVar4;
  PrintLanguageCapability *pPVar5;
  undefined4 extraout_var;
  OptionDatabase *this_00;
  _Rb_tree_header *p_Var6;
  
  AddrSpaceManager::AddrSpaceManager(&this->super_AddrSpaceManager);
  (this->super_AddrSpaceManager)._vptr_AddrSpaceManager = (_func_int **)&PTR__Architecture_003bde78;
  (this->archid)._M_dataplus._M_p = (pointer)&(this->archid).field_2;
  (this->archid)._M_string_length = 0;
  (this->archid).field_2._M_local_buf[0] = '\0';
  (this->extra_pool_rules).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->extra_pool_rules).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->extra_pool_rules).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var6 = &(this->protoModels)._M_t._M_impl.super__Rb_tree_header;
  (this->protoModels)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->protoModels)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->protoModels)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var6->_M_header;
  (this->protoModels)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var6->_M_header;
  (this->protoModels)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var6 = &(this->nohighptr).tree._M_t._M_impl.super__Rb_tree_header;
  (this->nohighptr).tree._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->nohighptr).tree._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->nohighptr).tree._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var6->_M_header;
  (this->nohighptr).tree._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var6->_M_header;
  (this->nohighptr).tree._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->printlist).super__Vector_base<PrintLanguage_*,_std::allocator<PrintLanguage_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->printlist).super__Vector_base<PrintLanguage_*,_std::allocator<PrintLanguage_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->printlist).super__Vector_base<PrintLanguage_*,_std::allocator<PrintLanguage_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->inst).super__Vector_base<TypeOp_*,_std::allocator<TypeOp_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->inst).super__Vector_base<TypeOp_*,_std::allocator<TypeOp_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->inst).super__Vector_base<TypeOp_*,_std::allocator<TypeOp_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  UserOpManage::UserOpManage(&this->userops);
  (this->splitrecords).super__Vector_base<PreferSplitRecord,_std::allocator<PreferSplitRecord>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->allacts).currentact = (Action *)0x0;
  (this->splitrecords).super__Vector_base<PreferSplitRecord,_std::allocator<PreferSplitRecord>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->splitrecords).super__Vector_base<PreferSplitRecord,_std::allocator<PreferSplitRecord>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->allacts).currentactname._M_dataplus._M_p = (pointer)&(this->allacts).currentactname.field_2
  ;
  (this->allacts).currentactname._M_string_length = 0;
  (this->allacts).currentactname.field_2._M_local_buf[0] = '\0';
  p_Var6 = &(this->allacts).groupmap._M_t._M_impl.super__Rb_tree_header;
  (this->allacts).groupmap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->allacts).groupmap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->allacts).groupmap._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var6->_M_header
  ;
  (this->allacts).groupmap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var6->_M_header;
  (this->allacts).groupmap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var6 = &(this->allacts).actionmap._M_t._M_impl.super__Rb_tree_header;
  (this->allacts).actionmap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->allacts).actionmap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->allacts).actionmap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var6->_M_header;
  (this->allacts).actionmap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var6->_M_header;
  (this->allacts).actionmap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->trim_recurse_max = 5;
  this->max_implied_ref = 2;
  this->max_term_duplication = 2;
  this->max_basetype_size = 10;
  this->min_funcsymbol_size = 1;
  this->aggressive_ext_trim = false;
  this->readonlypropagate = false;
  this->infer_pointers = true;
  this->pointer_lowerbound = 0x1000;
  this->funcptr_align = 0;
  this->flowoptions = 0;
  this->defaultfp = (ProtoModel *)0x0;
  (this->defaultReturnAddr).space = (AddrSpace *)0x0;
  this->loader = (LoadImage *)0x0;
  this->pcodeinjectlib = (PcodeInjectLibrary *)0x0;
  this->types = (TypeFactory *)0x0;
  this->translate = (Translate *)0x0;
  this->evalfp_current = (ProtoModel *)0x0;
  this->evalfp_called = (ProtoModel *)0x0;
  this->commentdb = (CommentDatabase *)0x0;
  this->cpool = (ConstantPool *)0x0;
  pDVar4 = (Database *)operator_new(0x90);
  p_Var6 = &(pDVar4->resolvemap).tree._M_t._M_impl.super__Rb_tree_header;
  (pDVar4->resolvemap).tree._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (pDVar4->resolvemap).tree._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pDVar4->resolvemap).tree._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var6->_M_header;
  (pDVar4->resolvemap).tree._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var6->_M_header;
  (pDVar4->resolvemap).tree._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  plVar1 = &(pDVar4->resolvemap).record;
  (pDVar4->resolvemap).record.super__List_base<ScopeMapper,_std::allocator<ScopeMapper>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)plVar1;
  (pDVar4->resolvemap).record.super__List_base<ScopeMapper,_std::allocator<ScopeMapper>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)plVar1;
  (pDVar4->resolvemap).record.super__List_base<ScopeMapper,_std::allocator<ScopeMapper>_>._M_impl.
  _M_node._M_size = 0;
  p_Var6 = &(pDVar4->flagbase).database._M_t._M_impl.super__Rb_tree_header;
  (pDVar4->flagbase).database._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (pDVar4->flagbase).database._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (pDVar4->flagbase).database._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var6->_M_header;
  (pDVar4->flagbase).database._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var6->_M_header;
  (pDVar4->flagbase).database._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pDVar4->glb = this;
  pDVar4->globalscope = (Scope *)0x0;
  (pDVar4->flagbase).defaultvalue = 0;
  this->symboltab = pDVar4;
  this->context = (ContextDatabase *)0x0;
  pPVar5 = PrintLanguageCapability::getDefault();
  iVar3 = (*(pPVar5->super_CapabilityPoint)._vptr_CapabilityPoint[3])(pPVar5,this);
  this->print = (PrintLanguage *)CONCAT44(extraout_var,iVar3);
  __position._M_current =
       (this->printlist).super__Vector_base<PrintLanguage_*,_std::allocator<PrintLanguage_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->printlist).super__Vector_base<PrintLanguage_*,_std::allocator<PrintLanguage_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<PrintLanguage*,std::allocator<PrintLanguage*>>::
    _M_realloc_insert<PrintLanguage*const&>
              ((vector<PrintLanguage*,std::allocator<PrintLanguage*>> *)&this->printlist,__position,
               &this->print);
  }
  else {
    *__position._M_current = (PrintLanguage *)CONCAT44(extraout_var,iVar3);
    pppPVar2 = &(this->printlist).
                super__Vector_base<PrintLanguage_*,_std::allocator<PrintLanguage_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppPVar2 = *pppPVar2 + 1;
  }
  this_00 = (OptionDatabase *)operator_new(0x38);
  OptionDatabase::OptionDatabase(this_00,this);
  this->options = this_00;
  this->loadersymbols_parsed = false;
  return;
}

Assistant:

Architecture::Architecture(void)

{
  //  endian = -1;
  trim_recurse_max = 5;		// Reasonable default value
  max_implied_ref = 2;		// 2 is best, in specific cases a higher number might be good
  max_term_duplication = 2;	// 2 and 3 (4) are pretty reasonable
  max_basetype_size = 10;	// Needs to be 8 or bigger
  min_funcsymbol_size = 1;
  aggressive_ext_trim = false;
  readonlypropagate = false;
  infer_pointers = true;
  pointer_lowerbound = 0x1000;
  funcptr_align = 0;
  flowoptions = 0;
  defaultfp = (ProtoModel *)0;
  defaultReturnAddr.space = (AddrSpace *)0;
  evalfp_current = (ProtoModel *)0;
  evalfp_called = (ProtoModel *)0;
  types = (TypeFactory *)0;
  translate = (Translate *)0;
  loader = (LoadImage *)0;
  pcodeinjectlib = (PcodeInjectLibrary *)0;
  commentdb = (CommentDatabase *)0;
  cpool = (ConstantPool *)0;
  symboltab = new Database(this);
  context = (ContextDatabase *)0;
  print = PrintLanguageCapability::getDefault()->buildLanguage(this);
  printlist.push_back(print);
  options = new OptionDatabase(this);
  loadersymbols_parsed = false;
#ifdef CPUI_STATISTICS
  stats = new Statistics();
#endif
#ifdef OPACTION_DEBUG
  debugstream = (ostream *)0;
#endif
}